

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O2

Array<const_char> * __thiscall
capnp::SchemaFile::DiskSchemaFile::readContent
          (Array<const_char> *__return_storage_ptr__,DiskSchemaFile *this)

{
  ReadableFile *pRVar1;
  Array<const_char> *result;
  Array<const_unsigned_char> local_68;
  undefined1 local_48 [8];
  undefined8 local_40;
  
  pRVar1 = (this->file).ptr;
  (*(pRVar1->super_FsNode)._vptr_FsNode[2])(local_48,pRVar1);
  (*(pRVar1->super_FsNode)._vptr_FsNode[7])(&local_68,pRVar1,0,local_40);
  if (local_68.disposer == (ArrayDisposer *)0x0) {
    __return_storage_ptr__->ptr = (char *)0x0;
    __return_storage_ptr__->size_ = 0;
    __return_storage_ptr__->disposer = (ArrayDisposer *)0x0;
  }
  else {
    __return_storage_ptr__->ptr = (char *)local_68.ptr;
    __return_storage_ptr__->size_ = local_68.size_;
    __return_storage_ptr__->disposer = local_68.disposer;
    local_68.ptr = (uchar *)0x0;
    local_68.size_ = 0;
  }
  kj::Array<const_unsigned_char>::~Array(&local_68);
  return __return_storage_ptr__;
}

Assistant:

kj::Array<const char> readContent() const override {
    return file->mmap(0, file->stat().size).releaseAsChars();
  }